

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void EVauto_submit_func(CManager_conflict cm,void *vstone)

{
  int iVar1;
  event_item *event;
  CManager_conflict evp;
  
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                   ,0xc5d);
  event = (event_item *)INT_CMmalloc(0x68);
  event->ref_count = 0;
  event->event_encoded = 0;
  *(undefined8 *)&event->contents = 0;
  event->encoded_event = (void *)0x0;
  event->event_len = 0;
  event->decoded_event = (void *)0x0;
  event->encoded_eventv = (FFSEncodeVector)0x0;
  event->cm = (CManager_conflict)0x0;
  event->free_arg = (void *)0x0;
  event->reference_format = (FMFormat)0x0;
  event->ioBuffer = (FFSBuffer)0x0;
  event->format = (CMFormat)0x0;
  event->attrs = (attr_list)0x0;
  event->free_func = (EVFreeFunction)0x0;
  event->ref_count = 1;
  event->event_encoded = 0;
  event->event_len = -1;
  event->decoded_event = (void *)0x0;
  event->cm = cm;
  internal_path_submit(cm,(int)vstone,event);
  do {
    evp = cm;
    iVar1 = process_local_actions(cm);
  } while (iVar1 != 0);
  return_event((event_path_data)evp,event);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                     ,0xc69);
  return;
}

Assistant:

static void
EVauto_submit_func(CManager cm, void* vstone)
{
    int stone_num = (int)(intptr_t) vstone;
    event_item *event;
    CManager_lock(cm);
    event = get_free_event(cm->evp);
    event->event_encoded = 0;
    event->decoded_event = NULL;
    event->reference_format = NULL;
    event->format = NULL;
    event->free_func = NULL;
    event->attrs = NULL;
    event->cm = cm;
    internal_path_submit(cm, stone_num, event);
    while (process_local_actions(cm));
    return_event(cm->evp, event);
    CManager_unlock(cm);
}